

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::io::anon_unknown_0::TokenizerTest_ParseInteger_Test::TestBody
          (TokenizerTest_ParseInteger_Test *this)

{
  AssertionResult *pAVar1;
  bool bVar2;
  pointer *__ptr;
  string *psVar3;
  char *pcVar4;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var5;
  char *in_R9;
  long lVar6;
  char decimal [32];
  char hex [32];
  uint64_t i_1;
  uint64_t parsed_4;
  AssertionResult gtest_ar;
  uint64_t parsed;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80 [3];
  uint64_t parsed_2;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  AssertHelper local_58;
  uint64_t i;
  uint64_t local_48;
  AssertHelper local_40;
  long local_38;
  
  parsed = parsed & 0xffffffff00000000;
  psVar3 = (string *)0xfe02d7;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,psVar3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0","ParseInteger(\"0\")",(int *)&parsed,(unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x362,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  parsed = CONCAT44(parsed._4_4_,0x7b);
  psVar3 = (string *)0xe5e364;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"123",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,psVar3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"123","ParseInteger(\"123\")",(int *)&parsed,(unsigned_long *)hex
            );
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x363,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  parsed = CONCAT44(parsed._4_4_,0xabcdef12);
  pcVar4 = "0xabcdef12";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0xabcdef12",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,(string *)pcVar4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"0xabcdef12u","ParseInteger(\"0xabcdef12\")",(uint *)&parsed,
             (unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x364,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  parsed = CONCAT44(parsed._4_4_,0xabcdef12);
  pcVar4 = "0xABCDEF12";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0xABCDEF12",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,(string *)pcVar4);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"0xabcdef12u","ParseInteger(\"0xABCDEF12\")",(uint *)&parsed,
             (unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x365,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pcVar4 = "0xFFFFFFFFFFFFFFFF";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0xFFFFFFFFFFFFFFFF",(allocator<char> *)&parsed);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,(string *)pcVar4);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"kuint64max","ParseInteger(\"0xFFFFFFFFFFFFFFFF\")",&kuint64max,
             (unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x366,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  parsed = CONCAT44(parsed._4_4_,0x53977);
  pcVar4 = "01234567";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"01234567",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,(string *)pcVar4);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"01234567","ParseInteger(\"01234567\")",(int *)&parsed,
             (unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x367,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  parsed = CONCAT44(parsed._4_4_,0x123);
  pcVar4 = "0X123";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0X123",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,(string *)pcVar4);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0X123","ParseInteger(\"0X123\")",(int *)&parsed,
             (unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x368,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  parsed = parsed & 0xffffffff00000000;
  psVar3 = (string *)0x11473a2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0x",(allocator<char> *)&parsed_2);
  hex._0_8_ = TokenizerTest::ParseInteger((TokenizerTest *)decimal,psVar3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"0","ParseInteger(\"0x\")",(int *)&parsed,(unsigned_long *)hex);
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)decimal);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)hex,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x36b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)hex,(Message *)decimal);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)hex);
    if (decimal._0_8_ != 0) {
      (**(code **)(*(long *)decimal._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"zxy",(allocator<char> *)hex)
  ;
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"zxy\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x370,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"1.2",(allocator<char> *)hex)
  ;
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1.2\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x371,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"08",(allocator<char> *)hex);
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"08\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x372,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"0xg",(allocator<char> *)hex)
  ;
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0xg\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x373,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"-1",(allocator<char> *)hex);
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"-1\", kuint64max, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x374,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"0",(allocator<char> *)hex);
  gtest_ar.success_ = Tokenizer::ParseInteger((string *)decimal,0,&i);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0\", 0, &i)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x377,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"1",(allocator<char> *)hex);
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 0, &i)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x378,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>((string *)decimal,"1",(allocator<char> *)hex);
  gtest_ar.success_ = Tokenizer::ParseInteger((string *)decimal,1,&i);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"1\", 1, &i)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x379,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"12345",(allocator<char> *)hex);
  gtest_ar.success_ = Tokenizer::ParseInteger((string *)decimal,0x3039,&i);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"12345\", 12345, &i)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37a,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"12346",(allocator<char> *)hex);
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0x3039,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"12346\", 12345, &i)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37b,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0xFFFFFFFFFFFFFFFF",(allocator<char> *)hex);
  gtest_ar.success_ = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0xFFFFFFFFFFFFFFFF\", kuint64max, &i)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37c,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)decimal,"0x10000000000000000",(allocator<char> *)hex);
  bVar2 = Tokenizer::ParseInteger((string *)decimal,0xffffffffffffffff,&i);
  gtest_ar.success_ = !bVar2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::__cxx11::string::~string((string *)decimal);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)hex);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)decimal,(internal *)&gtest_ar,
               (AssertionResult *)"Tokenizer::ParseInteger(\"0x10000000000000000\", kuint64max, &i)"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&parsed,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x37d,(char *)decimal._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&parsed,(Message *)hex);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed);
    std::__cxx11::string::~string((string *)decimal);
    if (hex._0_8_ != 0) {
      (**(code **)(*(long *)hex._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  lVar6 = -0x640;
  local_48 = 0xc81;
  while (bVar2 = local_48 != 0, local_48 = local_48 + -1, bVar2) {
    i_1 = lVar6 + 0x7fffffffffffffff;
    snprintf(decimal,0x20,"%llu");
    if (lVar6 < 1) {
      parsed = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&parsed_2);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0x7fffffffffffffff,&parsed);
      hex[0] = bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&parsed_2);
        std::operator<<((ostream *)(parsed_2 + 0x10),decimal);
        std::operator<<((ostream *)(parsed_2 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(parsed_2 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&parsed_2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (parsed_2 != 0) {
          (**(code **)(*(long *)parsed_2 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hex + 8));
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"parsed","i",&parsed,&i_1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)hex);
        pcVar4 = anon_var_dwarf_651463 + 5;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x38e,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_2,(Message *)hex);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_2);
        if (hex._0_8_ != 0) {
          (**(code **)(*(long *)hex._0_8_ + 8))();
        }
      }
      pAVar1 = &gtest_ar;
    }
    else {
      parsed = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&parsed_2);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0x7fffffffffffffff,&parsed);
      hex[0] = !bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&parsed_2);
        std::operator<<((ostream *)(parsed_2 + 0x10),decimal);
        std::operator<<((ostream *)(parsed_2 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(parsed_2 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x388,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&parsed_2);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (parsed_2 != 0) {
          (**(code **)(*(long *)parsed_2 + 8))();
        }
      }
      pAVar1 = (AssertionResult *)hex;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&pAVar1->message_);
    snprintf(&gtest_ar.success_,0x20,"0%llo",i_1);
    if (lVar6 < 1) {
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)hex,&gtest_ar.success_,(allocator<char> *)&parsed_4);
      bVar2 = Tokenizer::ParseInteger((string *)hex,0x7fffffffffffffff,&parsed_2);
      parsed = CONCAT71(parsed._1_7_,bVar2);
      local_80[0]._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)hex);
      if ((char)parsed == '\0') {
        testing::Message::Message((Message *)&parsed_4);
        std::operator<<((ostream *)(parsed_4 + 0x10),&gtest_ar.success_);
        std::operator<<((ostream *)(parsed_4 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(parsed_4 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)hex,(internal *)&parsed,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x398,(char *)hex._0_8_);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&parsed_4);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        std::__cxx11::string::~string((string *)hex);
        if (parsed_4 != 0) {
          (**(code **)(*(long *)parsed_4 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)hex,"parsed","i",(unsigned_long *)&parsed_2,&i_1);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&parsed);
        pcVar4 = anon_var_dwarf_651463 + 5;
        if (hex._8_8_ != 0) {
          pcVar4 = *(char **)hex._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x39a,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&parsed);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        if (parsed != 0) {
          (**(code **)(*(long *)parsed + 8))();
        }
      }
      p_Var5 = (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(hex + 8);
    }
    else {
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)hex,&gtest_ar.success_,(allocator<char> *)&parsed_4);
      bVar2 = Tokenizer::ParseInteger((string *)hex,0x7fffffffffffffff,&parsed_2);
      parsed = CONCAT71(parsed._1_7_,!bVar2);
      local_80[0]._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)hex);
      if ((char)parsed == '\0') {
        testing::Message::Message((Message *)&parsed_4);
        std::operator<<((ostream *)(parsed_4 + 0x10),&gtest_ar.success_);
        std::operator<<((ostream *)(parsed_4 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(parsed_4 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)hex,(internal *)&parsed,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x394,(char *)hex._0_8_);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&parsed_4);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        std::__cxx11::string::~string((string *)hex);
        if (parsed_4 != 0) {
          (**(code **)(*(long *)parsed_4 + 8))();
        }
      }
      p_Var5 = local_80;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)p_Var5);
    snprintf(hex,0x20,"0x%llx",i_1);
    if (lVar6 < 1) {
      parsed_4 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parsed,hex,(allocator<char> *)&local_58);
      bVar2 = Tokenizer::ParseInteger((string *)&parsed,0x7fffffffffffffff,&parsed_4);
      parsed_2 = CONCAT71(parsed_2._1_7_,bVar2);
      local_60._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)&parsed);
      if ((char)parsed_2 == '\0') {
        testing::Message::Message((Message *)&local_58);
        std::operator<<((ostream *)&(local_58.data_)->line,hex);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed,(internal *)&parsed_2,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a4,(char *)parsed);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        std::__cxx11::string::~string((string *)&parsed);
        if (local_58.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_58.data_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_60);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&parsed,"parsed","i",(unsigned_long *)&parsed_4,&i_1);
      if ((char)parsed == '\0') {
        testing::Message::Message((Message *)&parsed_2);
        pcVar4 = anon_var_dwarf_651463 + 5;
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_80[0]._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = *(char **)local_80[0]._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a5,pcVar4);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&parsed_2);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (parsed_2 != 0) {
          (**(code **)(*(long *)parsed_2 + 8))();
        }
      }
      p_Var5 = local_80;
    }
    else {
      parsed_4 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parsed,hex,(allocator<char> *)&local_58);
      bVar2 = Tokenizer::ParseInteger((string *)&parsed,0x7fffffffffffffff,&parsed_4);
      parsed_2 = CONCAT71(parsed_2._1_7_,!bVar2);
      local_60._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::__cxx11::string::~string((string *)&parsed);
      if ((char)parsed_2 == '\0') {
        testing::Message::Message((Message *)&local_58);
        std::operator<<((ostream *)&(local_58.data_)->line,hex);
        std::operator<<((ostream *)&(local_58.data_)->line,"=>");
        std::ostream::_M_insert<unsigned_long>((ulong)&(local_58.data_)->line);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&parsed,(internal *)&parsed_2,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3a0,(char *)parsed);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        std::__cxx11::string::~string((string *)&parsed);
        if (local_58.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_58.data_ + 8))();
        }
      }
      p_Var5 = &local_60;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)p_Var5);
    lVar6 = lVar6 + 1;
  }
  lVar6 = 0xf;
  while (lVar6 != 0xc90) {
    parsed = lVar6 - 0x650;
    local_48 = parsed;
    local_38 = lVar6;
    snprintf(decimal,0x20,"1844674407370955%04llu");
    if (lVar6 == 0x64f || lVar6 + -0x64f < 0) {
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&i_1);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0xffffffffffffffff,&parsed_2);
      hex[0] = bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&i_1);
        std::operator<<((ostream *)(i_1 + 0x10),decimal);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&i_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (i_1 != 0) {
          (**(code **)(*(long *)i_1 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hex + 8));
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"parsed","i",&parsed_2,&parsed);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)hex);
        pcVar4 = anon_var_dwarf_651463 + 5;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3bd,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,(Message *)hex);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
        if (hex._0_8_ != 0) {
          (**(code **)(*(long *)hex._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      parsed = local_48;
      snprintf(decimal,0x20,"0%llo");
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&i_1);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0xffffffffffffffff,&parsed_2);
      hex[0] = bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&i_1);
        std::operator<<((ostream *)(i_1 + 0x10),decimal);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&i_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (i_1 != 0) {
          (**(code **)(*(long *)i_1 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hex + 8));
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"parsed","i",&parsed_2,&parsed);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)hex);
        pcVar4 = anon_var_dwarf_651463 + 5;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3cf,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,(Message *)hex);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
        if (hex._0_8_ != 0) {
          (**(code **)(*(long *)hex._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      parsed = local_48;
      snprintf(decimal,0x20,"0x%llx");
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&i_1);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0xffffffffffffffff,&parsed_2);
      hex[0] = bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&i_1);
        std::operator<<((ostream *)(i_1 + 0x10),decimal);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3de,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&i_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (i_1 != 0) {
          (**(code **)(*(long *)i_1 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hex + 8));
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"parsed","ui",&parsed_2,&parsed);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)hex);
        pcVar4 = anon_var_dwarf_651463 + 5;
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&i_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3df,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,(Message *)hex);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
        if (hex._0_8_ != 0) {
          (**(code **)(*(long *)hex._0_8_ + 8))();
        }
      }
      pAVar1 = &gtest_ar;
    }
    else {
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&i_1);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0xffffffffffffffff,&parsed_2);
      hex[0] = !bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&i_1);
        std::operator<<((ostream *)(i_1 + 0x10),decimal);
        std::operator<<((ostream *)(i_1 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(i_1 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(decimal, kuint64max, &parsed)","true"
                   ,"false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3b7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&i_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (i_1 != 0) {
          (**(code **)(*(long *)i_1 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hex + 8));
      parsed = local_48;
      snprintf(decimal,0x20,"0200000000000000000%04llo");
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&i_1);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0xffffffffffffffff,&parsed_2);
      hex[0] = !bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&i_1);
        std::operator<<((ostream *)(i_1 + 0x10),decimal);
        std::operator<<((ostream *)(i_1 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(i_1 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(octal, kuint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3c7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&i_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (i_1 != 0) {
          (**(code **)(*(long *)i_1 + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(hex + 8));
      parsed = local_48;
      snprintf(decimal,0x20,"0x1000000000000%04llx");
      parsed_2 = 0xffffffffffffffff;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar,decimal,(allocator<char> *)&i_1);
      bVar2 = Tokenizer::ParseInteger((string *)&gtest_ar,0xffffffffffffffff,&parsed_2);
      hex[0] = !bVar2;
      hex[8] = '\0';
      hex[9] = '\0';
      hex[10] = '\0';
      hex[0xb] = '\0';
      hex[0xc] = '\0';
      hex[0xd] = '\0';
      hex[0xe] = '\0';
      hex[0xf] = '\0';
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (hex[0] == '\0') {
        testing::Message::Message((Message *)&i_1);
        std::operator<<((ostream *)(i_1 + 0x10),decimal);
        std::operator<<((ostream *)(i_1 + 0x10),"=>");
        std::ostream::_M_insert<unsigned_long>(i_1 + 0x10);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)hex,
                   (AssertionResult *)"Tokenizer::ParseInteger(hex, kuint64max, &parsed)","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parsed_4,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                   ,0x3d9,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&parsed_4,(Message *)&i_1);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parsed_4);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (i_1 != 0) {
          (**(code **)(*(long *)i_1 + 8))();
        }
      }
      pAVar1 = (AssertionResult *)hex;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&pAVar1->message_);
    lVar6 = local_38 + 1;
  }
  return;
}

Assistant:

TEST_F(TokenizerTest, ParseInteger) {
  EXPECT_EQ(0, ParseInteger("0"));
  EXPECT_EQ(123, ParseInteger("123"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xabcdef12"));
  EXPECT_EQ(0xabcdef12u, ParseInteger("0xABCDEF12"));
  EXPECT_EQ(kuint64max, ParseInteger("0xFFFFFFFFFFFFFFFF"));
  EXPECT_EQ(01234567, ParseInteger("01234567"));
  EXPECT_EQ(0X123, ParseInteger("0X123"));

  // Test invalid integers that may still be tokenized as integers.
  EXPECT_EQ(0, ParseInteger("0x"));

  uint64_t i;

  // Test invalid integers that will never be tokenized as integers.
  EXPECT_FALSE(Tokenizer::ParseInteger("zxy", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1.2", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("08", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0xg", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("-1", kuint64max, &i));

  // Test overflows.
  EXPECT_TRUE(Tokenizer::ParseInteger("0", 0, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("1", 0, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("1", 1, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("12345", 12345, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("12346", 12345, &i));
  EXPECT_TRUE(Tokenizer::ParseInteger("0xFFFFFFFFFFFFFFFF", kuint64max, &i));
  EXPECT_FALSE(Tokenizer::ParseInteger("0x10000000000000000", kuint64max, &i));

  // Test near the limits of signed parsing (values in kint64max +/- 1600)
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    // We make sure to perform an unsigned addition so that we avoid signed
    // overflow, which would be undefined behavior.
    uint64_t i = 0x7FFFFFFFFFFFFFFFu + static_cast<uint64_t>(offset);
    char decimal[32];
    snprintf(decimal, 32, "%llu", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kint64max, &parsed))
          << decimal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char octal[32];
    snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(octal, kint64max, &parsed))
          << octal << "=>" << parsed;
      EXPECT_EQ(parsed, i);
    }
    char hex[32];
    snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(i));
    if (offset > 0) {
      uint64_t parsed = -1;
      EXPECT_FALSE(Tokenizer::ParseInteger(hex, kint64max, &parsed))
          << hex << "=>" << parsed;
    } else {
      uint64_t parsed = -1;
      EXPECT_TRUE(Tokenizer::ParseInteger(hex, kint64max, &parsed)) << hex;
      EXPECT_EQ(parsed, i);
    }
    // EXPECT_NE(offset, -237);
  }

  // Test near the limits of unsigned parsing (values in kuint64max +/- 1600)
  // By definition, values greater than kuint64max cannot be held in a uint64_t
  // variable, so printing them is a little tricky; fortunately all but the
  // last four digits are known, so we can hard-code them in the printf string,
  // and we only need to format the last 4.
  for (int64_t offset = -1600; offset <= 1600; ++offset) {
    {
      uint64_t i = 18446744073709551615u + offset;
      char decimal[32];
      snprintf(decimal, 32, "1844674407370955%04llu",
               static_cast<unsigned long long>(1615 + offset));
      if (offset > 0) {
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal << "=>" << parsed;
      } else {
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(decimal, kuint64max, &parsed))
            << decimal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t i = 01777777777777777777777u + offset;
      if (offset > 0) {
        char octal[32];
        snprintf(octal, 32, "0200000000000000000%04llo",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal << "=>" << parsed;
      } else {
        char octal[32];
        snprintf(octal, 32, "0%llo", static_cast<unsigned long long>(i));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(octal, kuint64max, &parsed))
            << octal;
        EXPECT_EQ(parsed, i);
      }
    }
    {
      uint64_t ui = 0xffffffffffffffffu + offset;
      char hex[32];
      if (offset > 0) {
        snprintf(hex, 32, "0x1000000000000%04llx",
                 static_cast<unsigned long long>(offset - 1));
        uint64_t parsed = -1;
        EXPECT_FALSE(Tokenizer::ParseInteger(hex, kuint64max, &parsed))
            << hex << "=>" << parsed;
      } else {
        snprintf(hex, 32, "0x%llx", static_cast<unsigned long long>(ui));
        uint64_t parsed = -1;
        EXPECT_TRUE(Tokenizer::ParseInteger(hex, kuint64max, &parsed)) << hex;
        EXPECT_EQ(parsed, ui);
      }
    }
  }
}